

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nl-solver-c.cc
# Opt level: O3

void __thiscall
mp::NLW2_NLFeeder_C_Impl::
FeedSuffixes<mp::NLWriter2<mp::NLWriter2Params<mp::TextFormatter,mp::NLW2_NLFeeder_C_Impl>>::SuffixWriterFactory>
          (NLW2_NLFeeder_C_Impl *this,SuffixWriterFactory *swf)

{
  NLW2_SuffixWriter_C sw_c;
  SuffixDblWriter dbl_writer;
  SuffixIntWriter int_writer;
  _Any_data local_d8;
  code *local_c8;
  code *local_c0;
  _Any_data local_b8;
  code *local_a8;
  code *local_a0;
  undefined8 local_98;
  undefined8 uStack_90;
  code *local_88;
  undefined8 uStack_80;
  undefined8 local_78;
  undefined8 uStack_70;
  code *local_68;
  undefined8 uStack_60;
  anon_class_24_3_766800c0 local_50;
  SuffixIntWriter local_38;
  SuffixIntWriter local_28;
  
  local_68 = (code *)0x0;
  uStack_60 = 0;
  local_78 = 0;
  uStack_70 = 0;
  local_88 = (code *)0x0;
  uStack_80 = 0;
  local_98 = 0;
  uStack_90 = 0;
  local_b8._M_unused._M_object = &local_28;
  local_28.p_nlw_ =
       (NLWriter2<mp::NLWriter2Params<mp::TextFormatter,_mp::NLW2_NLFeeder_C_Impl>_> *)0x0;
  local_28.n_entries_ = 0;
  local_38.p_nlw_ =
       (NLWriter2<mp::NLWriter2Params<mp::TextFormatter,_mp::NLW2_NLFeeder_C_Impl>_> *)0x0;
  local_38.n_entries_ = 0;
  local_50.dbl_write_fn = (function<void_(int,_double)> *)&local_b8;
  local_b8._8_8_ = 0;
  local_a0 = std::
             _Function_handler<void_(int,_int),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ampl[P]mp/nl-writer2/src/nl-solver-c.cc:885:9)>
             ::_M_invoke;
  local_a8 = std::
             _Function_handler<void_(int,_int),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ampl[P]mp/nl-writer2/src/nl-solver-c.cc:885:9)>
             ::_M_manager;
  local_d8._8_8_ = 0;
  local_c0 = std::
             _Function_handler<void_(int,_double),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ampl[P]mp/nl-writer2/src/nl-solver-c.cc:887:9)>
             ::_M_invoke;
  local_c8 = std::
             _Function_handler<void_(int,_double),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ampl[P]mp/nl-writer2/src/nl-solver-c.cc:887:9)>
             ::_M_manager;
  local_d8._M_unused._M_object = &local_38;
  local_50.swf = swf;
  local_50.dbl_writer = (SuffixDblWriter *)local_b8._M_unused._0_8_;
  std::function<void*(char_const*,int,int)>::operator=
            ((function<void*(char_const*,int,int)> *)&local_98,(anon_class_24_3_37f068e0 *)&local_50
            );
  local_50.swf = swf;
  local_50.dbl_writer = (SuffixDblWriter *)&local_38;
  local_50.dbl_write_fn = (function<void_(int,_double)> *)&local_d8;
  std::function<void*(char_const*,int,int)>::operator=
            ((function<void*(char_const*,int,int)> *)&local_78,&local_50);
  (*(this->nlf2_c_).FeedSuffixes)((this->nlf2_c_).p_user_data_,&local_98);
  if (local_c8 != (code *)0x0) {
    (*local_c8)(&local_d8,&local_d8,__destroy_functor);
  }
  if (local_a8 != (code *)0x0) {
    (*local_a8)(&local_b8,&local_b8,__destroy_functor);
  }
  if (local_68 != (code *)0x0) {
    (*local_68)((function<void*(char_const*,int,int)> *)&local_78,
                (function<void*(char_const*,int,int)> *)&local_78,3);
  }
  if (local_88 != (code *)0x0) {
    (*local_88)(&local_98,&local_98,3);
  }
  return;
}

Assistant:

void mp::NLW2_NLFeeder_C_Impl::FeedSuffixes(SuffixWriterFactory& swf) {
  NLW2_SuffixWriter_C sw_c;
  decltype( swf.StartIntSuffix(nullptr, 0, 0) ) int_writer;
  decltype( swf.StartDblSuffix(nullptr, 0, 0) ) dbl_writer;
  // These would write sparse entries
  std::function<void(int, int)> int_write_fn
      = [&int_writer](int i, int v) { int_writer.Write(i, v); };
  std::function<void(int, double)> dbl_write_fn
      = [&dbl_writer](int i, double v) { dbl_writer.Write(i, v); };
  // There would start a suffix
  sw_c.int_suf_starter_ = [&swf, &int_writer, &int_write_fn]
      (const char* suf_name, int kind, int nnz) {
    int_writer = swf.StartIntSuffix(suf_name, kind, nnz);
    return (void*)(&int_write_fn);
  };
  sw_c.dbl_suf_starter_ = [&swf, &dbl_writer, &dbl_write_fn]
      (const char* suf_name, int kind, int nnz) {
    dbl_writer = swf.StartDblSuffix(suf_name, kind, nnz);
    return (void*)(&dbl_write_fn);
  };
  assert(NLF().FeedSuffixes);
  NLF().FeedSuffixes(NLF().p_user_data_, &sw_c);
}